

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

int __thiscall
Indexing::ClauseCodeTree::LiteralMatcher::init(LiteralMatcher *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  CodeOp **ppCVar3;
  undefined7 extraout_var;
  LitInfo *in_RCX;
  size_t in_R8;
  byte in_R9B;
  CodeOp *sop;
  CodeOp *in_stack_ffffffffffffffb8;
  CodeOp *this_00;
  
  CodeTree::Matcher::init(&this->super_Matcher,ctx);
  (this->super_Matcher).linfos = in_RCX;
  (this->super_Matcher).linfoCnt = in_R8;
  this->_eagerlyMatched = false;
  Lib::Stack<Indexing::CodeTree::CodeOp_*>::reset(&this->eagerResults);
  if ((in_R9B & 1) == 0) {
    bVar1 = CodeTree::Matcher::prepareLiteral(&this->super_Matcher);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  else {
    this->_eagerlyMatched = true;
    (this->super_Matcher)._fresh = false;
    this_00 = (this->super_Matcher).entry;
    while (iVar2 = (int)this_00, this_00 != (CodeOp *)0x0) {
      bVar1 = CodeTree::CodeOp::isSuccess((CodeOp *)this);
      if (bVar1) {
        Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
                  ((Stack<Indexing::CodeTree::CodeOp_*> *)this,in_stack_ffffffffffffffb8);
      }
      ppCVar3 = CodeTree::CodeOp::alternative(this_00);
      this_00 = *ppCVar3;
    }
  }
  return iVar2;
}

Assistant:

void ClauseCodeTree::LiteralMatcher::init(CodeTree* tree_, CodeOp* entry_,
					  LitInfo* linfos_, size_t linfoCnt_,
					  bool seekOnlySuccess)
{
  ASS_G(linfoCnt_,0);

  Matcher::init(tree_,entry_);

  linfos=linfos_;
  linfoCnt=linfoCnt_;

  _eagerlyMatched=false;
  eagerResults.reset();

  RSTAT_CTR_INC("LiteralMatcher::init");
  if(seekOnlySuccess) {
    RSTAT_CTR_INC("LiteralMatcher::init - seekOnlySuccess");
    //we are interested only in SUCCESS operations
    //(and those must be at the entry point or its alternatives)

    _eagerlyMatched=true;
    _fresh=false;
    CodeOp* sop=entry;
    while(sop) {
      if(sop->isSuccess()) {
	eagerResults.push(sop);
      }
      sop=sop->alternative();
    }
    return;
  }

  ALWAYS(prepareLiteral());
}